

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::BitfieldReverseCaseInstance::getInputValues
          (BitfieldReverseCaseInstance *this,int numValues,void **values)

{
  deUint32 dVar1;
  DataType dataType;
  Precision precision_00;
  const_reference pvVar2;
  ShaderSpec *this_00;
  deUint32 *inValue;
  Precision precision;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  BitfieldReverseCaseInstance *this_local;
  
  rnd.m_rnd._8_8_ = values;
  dVar1 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  de::Random::Random((Random *)&precision,dVar1 ^ 0xff23a4);
  this_00 = &(this->super_IntegerFunctionTestInstance).m_spec;
  pvVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&this_00->inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar2->varType);
  pvVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&this_00->inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar2->varType);
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionTestInstance).m_shaderType,dataType,
             precision_00,*(deUint32 **)rnd.m_rnd._8_8_,numValues);
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0xff23a4);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		deUint32*				inValue		= (deUint32*)values[0];

		generateRandomInputData(rnd, m_shaderType, type, precision, inValue, numValues);
	}